

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

uint aom_variance64x16_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  __m128i vsum_00;
  __m128i vsse_00;
  __m128i *in_RDX;
  int *in_R8;
  int sum;
  __m128i vsum;
  __m128i vsse;
  __m128i *sse_00;
  int in_stack_ffffffffffffff90;
  int iVar1;
  uint8_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  longlong lVar2;
  
  lVar2 = 0;
  iVar1 = 0;
  sse_00 = (__m128i *)&stack0xffffffffffffff98;
  variance64_sse2((uint8_t *)0x0,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,0,
                  in_stack_ffffffffffffff90,sse_00,in_RDX);
  vsse_00[0]._4_4_ = in_stack_ffffffffffffffa4;
  vsse_00[0]._0_4_ = in_stack_ffffffffffffffa0;
  vsse_00[1] = lVar2;
  vsum_00[0]._4_4_ = iVar1;
  vsum_00[0]._0_4_ = in_stack_ffffffffffffff90;
  vsum_00[1] = (longlong)in_stack_ffffffffffffff98;
  variance_final_1024_pel_sse2(vsse_00,vsum_00,(uint *)sse_00,(int *)0x4a8a0d);
  return *in_R8 - (int)((long)iVar1 * (long)iVar1 >> 10);
}

Assistant:

unsigned int aom_mse8x8_sse2(const uint8_t *src, int src_stride,
                             const uint8_t *ref, int ref_stride,
                             unsigned int *sse) {
  aom_variance8x8_sse2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}